

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
tracing_layer::zeKernelSuggestMaxCooperativeGroupCount
          (ze_kernel_handle_t hKernel,uint32_t *totalGroupCount)

{
  _func_void__ze_kernel_suggest_max_cooperative_group_count_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
  *p_Var1;
  _func__ze_result_t__ze_kernel_handle_t_ptr_uint_ptr *zeApiPtr;
  char *pcVar2;
  undefined1 *puVar3;
  ulong *puVar4;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_f0;
  vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
  local_d8;
  undefined1 local_c0 [8];
  APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
  epilogCallback;
  APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
  prologCallback;
  ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t epilogue_callback_ptr;
  ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t prologueCallbackPtr;
  size_t i;
  tracer_array_t *currentTracerArray;
  APITracerCallbackDataImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
  apiCallbackData;
  ze_kernel_suggest_max_cooperative_group_count_params_t tracerParams;
  ze_pfnKernelSuggestMaxCooperativeGroupCount_t pfnSuggestMaxCooperativeGroupCount;
  uint32_t *totalGroupCount_local;
  ze_kernel_handle_t hKernel_local;
  
  if (DAT_002da7b8 == (_func__ze_result_t__ze_kernel_handle_t_ptr_uint_ptr *)0x0) {
    hKernel_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    pfnSuggestMaxCooperativeGroupCount =
         (ze_pfnKernelSuggestMaxCooperativeGroupCount_t)totalGroupCount;
    totalGroupCount_local = (uint32_t *)hKernel;
    pcVar2 = (char *)tracingInProgress();
    if (*pcVar2 == '\0') {
      puVar3 = (undefined1 *)tracingInProgress();
      *puVar3 = 1;
      apiCallbackData.epilogCallbacks.
      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&totalGroupCount_local;
      APITracerCallbackDataImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
      puVar4 = (ulong *)(**(code **)(*pGlobalAPITracerContextImp + 0x10))();
      if (puVar4 != (ulong *)0x0) {
        for (prologueCallbackPtr = (ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t)0x0;
            prologueCallbackPtr < (ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t)*puVar4;
            prologueCallbackPtr = prologueCallbackPtr + 1) {
          epilogCallback.pUserData =
               *(void **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0x4a0);
          p_Var1 = *(_func_void__ze_kernel_suggest_max_cooperative_group_count_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                     **)(puVar4[1] + (long)prologueCallbackPtr * 0xcb8 + 0xaf8);
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData,(value_type *)&epilogCallback.pUserData);
          epilogCallback.current_api_callback =
               *(_func_void__ze_kernel_suggest_max_cooperative_group_count_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                 **)(puVar4[1] + 0xcb0 + (long)prologueCallbackPtr * 0xcb8);
          local_c0 = (undefined1  [8])p_Var1;
          std::
          vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
          ::push_back((vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                       *)&apiCallbackData.prologCallbacks.
                          super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_c0)
          ;
        }
      }
      zeApiPtr = DAT_002da7b8;
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_d8,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::vector(&local_f0,
               (vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                *)&apiCallbackData.prologCallbacks.
                   super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      hKernel_local._4_4_ =
           APITracerWrapperImp<_ze_result_t(*)(_ze_kernel_handle_t*,unsigned_int*),_ze_kernel_suggest_max_cooperative_group_count_params_t*,void(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t*,_ze_result_t,void*,void**),std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t*,_ze_result_t,void*,void**)>>>,std::vector<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t*,_ze_result_t,void*,void**)>,std::allocator<tracing_layer::APITracerCallbackStateImp<void(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t*,_ze_result_t,void*,void**)>>>,_ze_kernel_handle_t*&,unsigned_int*&>
                     (zeApiPtr,(_ze_kernel_suggest_max_cooperative_group_count_params_t *)
                               &apiCallbackData.epilogCallbacks.
                                super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (_func_void__ze_kernel_suggest_max_cooperative_group_count_params_t_ptr__ze_result_t_void_ptr_void_ptr_ptr
                       *)currentTracerArray,&local_d8,&local_f0,
                      (_ze_kernel_handle_t **)
                      apiCallbackData.epilogCallbacks.
                      super__Vector_base<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (uint **)&pfnSuggestMaxCooperativeGroupCount);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_f0);
      std::
      vector<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>,_std::allocator<tracing_layer::APITracerCallbackStateImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>_>_>
      ::~vector(&local_d8);
      APITracerCallbackDataImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
      ::~APITracerCallbackDataImp
                ((APITracerCallbackDataImp<void_(*)(_ze_kernel_suggest_max_cooperative_group_count_params_t_*,__ze_result_t,_void_*,_void_**)>
                  *)&currentTracerArray);
    }
    else {
      hKernel_local._4_4_ =
           (*DAT_002da7b8)((_ze_kernel_handle_t *)totalGroupCount_local,
                           (uint *)pfnSuggestMaxCooperativeGroupCount);
    }
  }
  return hKernel_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelSuggestMaxCooperativeGroupCount(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        uint32_t* totalGroupCount                       ///< [out] recommended total group count.
        )
    {
        auto pfnSuggestMaxCooperativeGroupCount = context.zeDdiTable.Kernel.pfnSuggestMaxCooperativeGroupCount;

        if( nullptr == pfnSuggestMaxCooperativeGroupCount)
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;

        ZE_HANDLE_TRACER_RECURSION(context.zeDdiTable.Kernel.pfnSuggestMaxCooperativeGroupCount, hKernel, totalGroupCount);

        // capture parameters
        ze_kernel_suggest_max_cooperative_group_count_params_t tracerParams = {
            &hKernel,
            &totalGroupCount
        };

        tracing_layer::APITracerCallbackDataImp<ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t> apiCallbackData;

        ZE_GEN_PER_API_CALLBACK_STATE(apiCallbackData, ze_pfnKernelSuggestMaxCooperativeGroupCountCb_t, Kernel, pfnSuggestMaxCooperativeGroupCountCb);


        return tracing_layer::APITracerWrapperImp(context.zeDdiTable.Kernel.pfnSuggestMaxCooperativeGroupCount,
                                                  &tracerParams,
                                                  apiCallbackData.apiOrdinal,
                                                  apiCallbackData.prologCallbacks,
                                                  apiCallbackData.epilogCallbacks,
                                                  *tracerParams.phKernel,
                                                  *tracerParams.ptotalGroupCount);
    }